

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleUuidCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *name;
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  int iVar4;
  uint uVar5;
  pointer pbVar7;
  string e_1;
  string uuid;
  string uuidNamespaceString;
  cmUuid uuidGenerator;
  string uuidType;
  string uuidName;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uuidNamespace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong uVar6;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar3 - (long)pbVar7) < 0x21) {
    std::__cxx11::string::string
              ((string *)&uuidNamespaceString,"UUID sub-command requires an output variable.",
               (allocator *)&uuidName);
    cmCommand::SetError(&this->super_cmCommand,&uuidNamespaceString);
    std::__cxx11::string::~string((string *)&uuidNamespaceString);
    return false;
  }
  uuidNamespaceString._M_dataplus._M_p = (pointer)&uuidNamespaceString.field_2;
  uuidNamespaceString._M_string_length = 0;
  name = pbVar7 + 1;
  uuidName._M_dataplus._M_p = (pointer)&uuidName.field_2;
  uuidName._M_string_length = 0;
  uuidNamespaceString.field_2._M_local_buf[0] = '\0';
  uuidName.field_2._M_local_buf[0] = '\0';
  uuidType._M_dataplus._M_p = (pointer)&uuidType.field_2;
  uuidType._M_string_length = 0;
  bVar2 = false;
  uuidType.field_2._M_local_buf[0] = '\0';
  uVar6 = 2;
  while (uVar6 < (ulong)((long)pbVar3 - (long)pbVar7 >> 5)) {
    bVar1 = std::operator==(pbVar7 + uVar6,"NAMESPACE");
    iVar4 = (int)uVar6;
    if (!bVar1) {
      bVar1 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar6,"NAME");
      if (bVar1) {
        if ((ulong)(iVar4 + 1) <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&uuidName);
          goto LAB_00312dc0;
        }
        std::__cxx11::string::string
                  ((string *)&uuid,"UUID sub-command, NAME requires a value.",(allocator *)&e_1);
        cmCommand::SetError(&this->super_cmCommand,&uuid);
      }
      else {
        bVar1 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar6,"TYPE");
        if (bVar1) {
          if ((ulong)(iVar4 + 1) <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&uuidType);
            goto LAB_00312dc0;
          }
          std::__cxx11::string::string
                    ((string *)&uuid,"UUID sub-command, TYPE requires a value.",(allocator *)&e_1);
          cmCommand::SetError(&this->super_cmCommand,&uuid);
        }
        else {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar6,"UPPER");
          if (bVar2) {
            uVar5 = iVar4 + 1;
            bVar2 = true;
            goto LAB_00312dc3;
          }
          std::operator+(&e_1,"UUID sub-command does not recognize option ",
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar6);
          std::operator+(&uuid,&e_1,".");
          std::__cxx11::string::~string((string *)&e_1);
          cmCommand::SetError(&this->super_cmCommand,&uuid);
        }
      }
LAB_0031308d:
      std::__cxx11::string::~string((string *)&uuid);
      bVar2 = false;
      goto LAB_00313099;
    }
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(iVar4 + 1)) {
      std::__cxx11::string::string
                ((string *)&uuid,"UUID sub-command, NAMESPACE requires a value.",(allocator *)&e_1);
      cmCommand::SetError(&this->super_cmCommand,&uuid);
      goto LAB_0031308d;
    }
    std::__cxx11::string::_M_assign((string *)&uuidNamespaceString);
LAB_00312dc0:
    uVar5 = iVar4 + 2;
LAB_00312dc3:
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (ulong)uVar5;
  }
  uuid._M_dataplus._M_p = (pointer)&uuid.field_2;
  uuid._M_string_length = 0;
  uuid.field_2._M_local_buf[0] = '\0';
  cmUuid::cmUuid(&uuidGenerator);
  uuidNamespace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uuidNamespace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uuidNamespace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cmUuid::StringToBinary(&uuidGenerator,&uuidNamespaceString,&uuidNamespace);
  if (bVar1) {
    bVar1 = std::operator==(&uuidType,"MD5");
    if (bVar1) {
      cmUuid::FromMd5(&e_1,&uuidGenerator,&uuidNamespace,&uuidName);
    }
    else {
      bVar1 = std::operator==(&uuidType,"SHA1");
      if (!bVar1) {
        std::operator+(&local_50,"UUID sub-command, unknown TYPE \'",&uuidType);
        std::operator+(&e_1,&local_50,"\'.");
        std::__cxx11::string::~string((string *)&local_50);
        cmCommand::SetError(&this->super_cmCommand,&e_1);
        goto LAB_00312ff8;
      }
      cmUuid::FromSha1(&e_1,&uuidGenerator,&uuidNamespace,&uuidName);
    }
    std::__cxx11::string::operator=((string *)&uuid,(string *)&e_1);
    std::__cxx11::string::~string((string *)&e_1);
    if (uuid._M_string_length != 0) {
      if (bVar2) {
        cmsys::SystemTools::UpperCase(&e_1,&uuid);
        std::__cxx11::string::operator=((string *)&uuid,(string *)&e_1);
        std::__cxx11::string::~string((string *)&e_1);
      }
      bVar2 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,uuid._M_dataplus._M_p);
      goto LAB_00313002;
    }
    std::__cxx11::string::string
              ((string *)&e_1,"UUID sub-command, generation failed.",(allocator *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&e_1);
  }
  else {
    std::__cxx11::string::string
              ((string *)&e_1,"UUID sub-command, malformed NAMESPACE UUID.",(allocator *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&e_1);
  }
LAB_00312ff8:
  std::__cxx11::string::~string((string *)&e_1);
  bVar2 = false;
LAB_00313002:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&uuidNamespace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&uuidGenerator);
  std::__cxx11::string::~string((string *)&uuid);
LAB_00313099:
  std::__cxx11::string::~string((string *)&uuidType);
  std::__cxx11::string::~string((string *)&uuidName);
  std::__cxx11::string::~string((string *)&uuidNamespaceString);
  return bVar2;
}

Assistant:

bool cmStringCommand::HandleUuidCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  unsigned int argsIndex = 1;

  if (args.size() < 2) {
    this->SetError("UUID sub-command requires an output variable.");
    return false;
  }

  const std::string& outputVariable = args[argsIndex++];

  std::string uuidNamespaceString;
  std::string uuidName;
  std::string uuidType;
  bool uuidUpperCase = false;

  while (args.size() > argsIndex) {
    if (args[argsIndex] == "NAMESPACE") {
      ++argsIndex;
      if (argsIndex >= args.size()) {
        this->SetError("UUID sub-command, NAMESPACE requires a value.");
        return false;
      }
      uuidNamespaceString = args[argsIndex++];
    } else if (args[argsIndex] == "NAME") {
      ++argsIndex;
      if (argsIndex >= args.size()) {
        this->SetError("UUID sub-command, NAME requires a value.");
        return false;
      }
      uuidName = args[argsIndex++];
    } else if (args[argsIndex] == "TYPE") {
      ++argsIndex;
      if (argsIndex >= args.size()) {
        this->SetError("UUID sub-command, TYPE requires a value.");
        return false;
      }
      uuidType = args[argsIndex++];
    } else if (args[argsIndex] == "UPPER") {
      ++argsIndex;
      uuidUpperCase = true;
    } else {
      std::string e =
        "UUID sub-command does not recognize option " + args[argsIndex] + ".";
      this->SetError(e);
      return false;
    }
  }

  std::string uuid;
  cmUuid uuidGenerator;

  std::vector<unsigned char> uuidNamespace;
  if (!uuidGenerator.StringToBinary(uuidNamespaceString, uuidNamespace)) {
    this->SetError("UUID sub-command, malformed NAMESPACE UUID.");
    return false;
  }

  if (uuidType == "MD5") {
    uuid = uuidGenerator.FromMd5(uuidNamespace, uuidName);
  } else if (uuidType == "SHA1") {
    uuid = uuidGenerator.FromSha1(uuidNamespace, uuidName);
  } else {
    std::string e = "UUID sub-command, unknown TYPE '" + uuidType + "'.";
    this->SetError(e);
    return false;
  }

  if (uuid.empty()) {
    this->SetError("UUID sub-command, generation failed.");
    return false;
  }

  if (uuidUpperCase) {
    uuid = cmSystemTools::UpperCase(uuid);
  }

  this->Makefile->AddDefinition(outputVariable, uuid.c_str());
  return true;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}